

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                     ImGuiWindowClass *window_class)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *ctx_00;
  bool bVar2;
  ImGuiID IVar3;
  ImGuiWindow *this;
  float fVar4;
  ImGuiWindow *host_window;
  char title [256];
  ImGuiWindowFlags window_flags;
  ImVec2 local_74;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiViewportFlags local_5c;
  ImGuiViewportFlags IStack_58;
  ImGuiDockNodeFlags local_54;
  ImGuiDockNodeFlags IStack_50;
  bool local_4c;
  bool bStack_4b;
  ImGuiDockNode *local_48;
  ImGuiDockNode *node;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiContext *ctx;
  ImGuiWindowClass *window_class_local;
  ImGuiDockNodeFlags flags_local;
  ImVec2 *size_arg_local;
  ImGuiID id_local;
  
  ctx_00 = GImGui;
  this = GetCurrentWindow();
  if (((ctx_00->IO).ConfigFlags & 0x40U) != 0) {
    window_class_local._4_4_ = flags;
    if ((this->SkipItems & 1U) != 0) {
      window_class_local._4_4_ = flags | 1;
    }
    if ((window_class_local._4_4_ & 0x400) != 0) {
      __assert_fail("(flags & ImGuiDockNodeFlags_DockSpace) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x37d1,
                    "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x37d2,
                    "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    local_48 = DockContextFindNodeByID(ctx_00,id);
    if (local_48 == (ImGuiDockNode *)0x0) {
      local_48 = DockContextAddNode(ctx_00,id);
      local_48->LocalFlags = local_48->LocalFlags | 0x800;
    }
    local_48->SharedFlags = window_class_local._4_4_;
    if (window_class == (ImGuiWindowClass *)0x0) {
      ImGuiWindowClass::ImGuiWindowClass((ImGuiWindowClass *)&content_avail);
    }
    else {
      content_avail.x = (float)window_class->ClassId;
      content_avail.y = (float)window_class->ParentViewportId;
      local_5c = window_class->ViewportFlagsOverrideSet;
      IStack_58 = window_class->ViewportFlagsOverrideClear;
      local_54 = window_class->DockNodeFlagsOverrideSet;
      IStack_50 = window_class->DockNodeFlagsOverrideClear;
      local_4c = window_class->DockingAlwaysTabBar;
      bStack_4b = window_class->DockingAllowUnclassed;
    }
    (local_48->WindowClass).ClassId = (ImGuiID)content_avail.x;
    (local_48->WindowClass).ParentViewportId = (ImGuiID)content_avail.y;
    (local_48->WindowClass).ViewportFlagsOverrideSet = local_5c;
    (local_48->WindowClass).ViewportFlagsOverrideClear = IStack_58;
    (local_48->WindowClass).DockNodeFlagsOverrideSet = local_54;
    (local_48->WindowClass).DockNodeFlagsOverrideClear = IStack_50;
    (local_48->WindowClass).DockingAlwaysTabBar = local_4c;
    (local_48->WindowClass).DockingAllowUnclassed = bStack_4b;
    if ((local_48->LastFrameActive == ctx_00->FrameCount) && ((window_class_local._4_4_ & 1) == 0))
    {
      bVar2 = ImGuiDockNode::IsDockSpace(local_48);
      if (bVar2) {
        __assert_fail("node->IsDockSpace() == false && \"Cannot call DockSpace() twice a frame with the same ID\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x37e3,
                      "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                     );
      }
      local_48->LocalFlags = local_48->LocalFlags | 0x400;
    }
    else {
      local_48->LocalFlags = local_48->LocalFlags | 0x400;
      if ((window_class_local._4_4_ & 1) == 0) {
        size = GetContentRegionAvail();
        local_74 = ImFloor(size_arg);
        if (local_74.x <= 0.0) {
          fVar4 = ImMax<float>(size.x + local_74.x,4.0);
          local_74.x = fVar4;
        }
        if (local_74.y <= 0.0) {
          fVar4 = ImMax<float>(size.y + local_74.y,4.0);
          local_74.y = fVar4;
        }
        bVar2 = false;
        if (0.0 < local_74.x) {
          bVar2 = 0.0 < local_74.y;
        }
        if (!bVar2) {
          __assert_fail("size.x > 0.0f && size.y > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x37f6,
                        "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        local_48->Pos = (this->DC).CursorPos;
        local_48->SizeRef = local_74;
        local_48->Size = local_48->SizeRef;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff84,0.0,0.0);
        SetNextWindowPos(&local_48->Pos,0,(ImVec2 *)&stack0xffffffffffffff84);
        SetNextWindowSize(&local_48->Size,0);
        (ctx_00->NextWindowData).PosUndock = false;
        ImFormatString((char *)&host_window,0x100,"%s/DockSpace_%08X",this->Name,(ulong)id);
        if ((0 < (local_48->Windows).Size) || (bVar2 = ImGuiDockNode::IsSplitNode(local_48), bVar2))
        {
          PushStyleColor(3,0);
        }
        PushStyleVar(7,0.0);
        Begin((char *)&host_window,(bool *)0x0,0x2100013b);
        PopStyleVar(1);
        if ((0 < (local_48->Windows).Size) || (bVar2 = ImGuiDockNode::IsSplitNode(local_48), bVar2))
        {
          PopStyleColor(1);
        }
        pIVar1 = ctx_00->CurrentWindow;
        pIVar1->DockNodeAsHost = local_48;
        IVar3 = ImGuiWindow::GetID(this,(char *)&host_window,(char *)0x0);
        pIVar1->ChildId = IVar3;
        local_48->HostWindow = pIVar1;
        local_48->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        bVar2 = ImGuiDockNode::IsRootNode(local_48);
        if (!bVar2) {
          __assert_fail("node->IsRootNode()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3815,
                        "void ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        bVar2 = ImGuiDockNode::IsLeafNode(local_48);
        if ((bVar2) && (bVar2 = ImGuiDockNode::IsCentralNode(local_48), !bVar2)) {
          local_48->LocalFlags = local_48->LocalFlags | 0x800;
        }
        DockNodeUpdate(local_48);
        End();
        ItemSize(&local_74,-1.0);
      }
      else {
        local_48->LastFrameAlive = ctx_00->FrameCount;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    IM_ASSERT(id != 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;
        return;
    }
    node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK Why do we need a child window to host a dockspace, could we host it in the existing window?
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    // FIXME-DOCK: What is the reason for not simply calling BeginChild()?
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PushStyleColor(ImGuiCol_ChildBg, IM_COL32(0, 0, 0, 0));
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PopStyleColor();

    ImGuiWindow* host_window = g.CurrentWindow;
    host_window->DockNodeAsHost = node;
    host_window->ChildId = window->GetID(title);
    node->HostWindow = host_window;
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());

    // We need to handle the rare case were a central node is missing.
    // This can happen if the node was first created manually with DockBuilderAddNode() but _without_ the ImGuiDockNodeFlags_Dockspace.
    // Doing it correctly would set the _CentralNode flags, which would then propagate according to subsequent split.
    // It would also be ambiguous to attempt to assign a central node while there are split nodes, so we wait until there's a single node remaining.
    // The specific sub-property of _CentralNode we are interested in recovering here is the "Don't delete when empty" property,
    // as it doesn't make sense for an empty dockspace to not have this property.
    if (node->IsLeafNode() && !node->IsCentralNode())
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;

    // Update the node
    DockNodeUpdate(node);

    End();
    ItemSize(size);
}